

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicKey.cpp
# Opt level: O1

bool jbcoin::verifyDigest(PublicKey *publicKey,uint256 *digest,Slice *sig,bool mustBeFullyCanonical)

{
  int iVar1;
  optional<jbcoin::ECDSACanonicality> oVar2;
  secp256k1_context *psVar3;
  secp256k1_ecdsa_signature *sig_00;
  secp256k1_pubkey pubkey_imp;
  secp256k1_ecdsa_signature sig_imp;
  secp256k1_ecdsa_signature sig_norm;
  secp256k1_pubkey local_f0;
  secp256k1_ecdsa_signature local_b0;
  secp256k1_ecdsa_signature local_70;
  
  if ((publicKey->size_ != 0x21) || ((publicKey->buf_[0] & 0xfe) != 2)) {
    std::__cxx11::string::string
              ((string *)&local_f0,"sign: secp256k1 required for digest signing",
               (allocator *)&local_b0);
    LogicError((string *)&local_f0);
  }
  psVar3 = (secp256k1_context *)sig;
  oVar2 = ecdsaCanonicality(sig);
  if (((ulong)oVar2.super_type & 1) != 0) {
    if (mustBeFullyCanonical) {
      if (((ulong)oVar2.super_type & 1) == 0) goto LAB_001a7d8c;
      if (oVar2.super_type.m_storage != fullyCanonical) {
        return false;
      }
    }
    secp256k1Context<void>();
    iVar1 = secp256k1_ec_pubkey_parse(psVar3,&local_f0,publicKey->buf_,publicKey->size_);
    if (iVar1 != 0) {
      secp256k1Context<void>();
      iVar1 = secp256k1_ecdsa_signature_parse_der(psVar3,&local_b0,sig->data_,sig->size_);
      if (iVar1 != 0) {
        if (((ulong)oVar2.super_type & 1) != 0) {
          if (oVar2.super_type.m_storage == fullyCanonical) {
            psVar3 = secp256k1Context<void>();
            sig_00 = &local_b0;
          }
          else {
            secp256k1Context<void>();
            iVar1 = secp256k1_ecdsa_signature_normalize(psVar3,&local_70,&local_b0);
            if (iVar1 == 0) {
              return false;
            }
            psVar3 = secp256k1Context<void>();
            sig_00 = &local_70;
          }
          iVar1 = secp256k1_ecdsa_verify(psVar3,sig_00,(uchar *)digest,&local_f0);
          return iVar1 != 0;
        }
LAB_001a7d8c:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                      "reference_const_type boost::optional<jbcoin::ECDSACanonicality>::get() const [T = jbcoin::ECDSACanonicality]"
                     );
      }
    }
  }
  return false;
}

Assistant:

boost::optional<KeyType>
publicKeyType (Slice const& slice)
{
    if (slice.size() == 33 &&
            slice[0] == 0xED)
        return KeyType::ed25519;
    if (slice.size() == 33 &&
        (slice[0] == 0x02 ||
            slice[0] == 0x03))
        return KeyType::secp256k1;
    return boost::none;
}